

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::NodeIntStateGetIncrement
          (ChNodeFEAxyzrot *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  char *__function;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ChVector<double> angle_axis;
  ChQuaternion<double> q_old;
  ChQuaternion<double> q_new;
  double *local_a8;
  double dStack_a0;
  double local_98;
  ChState *local_90;
  ulong local_88;
  long local_78;
  ChQuaternion<double> local_68;
  ChQuaternion<double> local_48;
  
  uVar6 = (ulong)off_x;
  lVar1 = (x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((lVar1 <= (long)uVar6) ||
     (local_78 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
     local_78 <= (long)uVar6)) {
LAB_006605c7:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  lVar2 = (Dv->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar2 <= (long)(ulong)off_v) {
LAB_006605e6:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  pdVar3 = (x_new->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_a8 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar4 = (Dv->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar4[off_v] = pdVar3[uVar6] - local_a8[uVar6];
  uVar6 = (ulong)(off_x + 1);
  if ((lVar1 <= (long)uVar6) || (local_78 <= (long)uVar6)) goto LAB_006605c7;
  if (lVar2 <= (long)(ulong)(off_v + 1)) goto LAB_006605e6;
  pdVar4[off_v + 1] = pdVar3[uVar6] - local_a8[uVar6];
  uVar6 = (ulong)(off_x + 2);
  if ((lVar1 <= (long)uVar6) || (local_78 <= (long)uVar6)) goto LAB_006605c7;
  if (lVar2 <= (long)(ulong)(off_v + 2)) goto LAB_006605e6;
  pdVar4[off_v + 2] = pdVar3[uVar6] - local_a8[uVar6];
  uVar6 = (ulong)(off_x + 3);
  local_a8 = local_a8 + uVar6;
  dStack_a0 = 1.97626258336499e-323;
  local_90 = x;
  if ((long)uVar6 <= local_78 + -4) {
    local_88 = uVar6;
    ChQuaternion<double>::
    ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_a8,(type *)0x0);
    local_a8 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar6;
    local_78 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    dStack_a0 = 1.97626258336499e-323;
    local_90 = x_new;
    if ((long)uVar6 <= local_78 + -4) {
      local_88 = uVar6;
      ChQuaternion<double>::
      ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a8,(type *)0x0);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_68.m_data[0];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_68.m_data[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_68.m_data[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_68.m_data[3];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_48.m_data[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_48.m_data[1];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_48.m_data[2];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_48.m_data[3];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_48.m_data[0] * local_68.m_data[1];
      auVar10 = vfmsub231sd_fma(auVar22,auVar12,auVar18);
      auVar10 = vfmadd231sd_fma(auVar10,auVar24,auVar15);
      auVar22 = vfnmadd231sd_fma(auVar10,auVar13,auVar11);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_48.m_data[0] * local_68.m_data[2];
      auVar10 = vfmsub231sd_fma(auVar20,auVar12,auVar15);
      auVar10 = vfnmadd231sd_fma(auVar10,auVar24,auVar18);
      auVar10 = vfmadd231sd_fma(auVar10,auVar16,auVar11);
      dVar19 = auVar10._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_68.m_data[3] * local_48.m_data[0];
      auVar10 = vfmsub231sd_fma(auVar23,auVar12,auVar11);
      auVar10 = vfmadd231sd_fma(auVar10,auVar13,auVar18);
      auVar16 = vfnmadd231sd_fma(auVar10,auVar16,auVar15);
      local_a8 = (double *)0x0;
      dStack_a0 = 0.0;
      local_98 = 0.0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar19 * dVar19;
      auVar10 = vfmadd231sd_fma(auVar10,auVar22,auVar22);
      auVar10 = vfmadd231sd_fma(auVar10,auVar16,auVar16);
      dVar9 = auVar10._0_8_;
      dVar21 = auVar22._0_8_;
      if (dVar9 <= 1e-30) {
        local_a8 = (double *)(dVar21 + dVar21);
        dVar9 = 2.0;
      }
      else {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_68.m_data[1] * local_48.m_data[1];
        auVar22 = vfmadd213sd_fma(auVar14,auVar12,auVar17);
        auVar22 = vfmadd213sd_fma(auVar15,auVar13,auVar22);
        auVar22 = vfmadd213sd_fma(auVar11,auVar24,auVar22);
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          auVar10 = vsqrtsd_avx(auVar10,auVar10);
          dVar9 = auVar10._0_8_;
        }
        dVar8 = atan2(dVar9,auVar22._0_8_);
        dVar9 = (dVar8 + dVar8) / dVar9;
        local_a8 = (double *)(dVar9 * dVar21);
      }
      dStack_a0 = dVar19 * dVar9;
      local_98 = auVar16._0_8_ * dVar9;
      uVar6 = (ulong)(off_v + 3);
      if ((long)uVar6 <=
          (Dv->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar4 = (Dv->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar3 = pdVar4 + uVar6;
        uVar7 = 3;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
          uVar7 = uVar5;
        }
        if (uVar7 != 0) {
          memcpy(pdVar3,&local_a8,(ulong)(uint)((int)uVar7 * 8));
        }
        if (uVar7 < 3) {
          uVar5 = (ulong)(uint)((int)uVar7 * 8);
          memcpy(pdVar4 + uVar6 + uVar7,(void *)((long)&local_a8 + uVar5),0x18 - uVar5);
        }
        return;
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00660631;
    }
  }
  dStack_a0 = 1.97626258336499e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  local_88 = uVar6;
LAB_00660631:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChNodeFEAxyzrot::NodeIntStateGetIncrement(const unsigned int off_x,
                                            const ChState& x_new,
                                            const ChState& x,
                                            const unsigned int off_v,
                                            ChStateDelta& Dv) {
    // POSITION:
    Dv(off_v) = x_new(off_x) - x(off_x);
    Dv(off_v + 1) = x_new(off_x + 1) - x(off_x + 1);
    Dv(off_v + 2) = x_new(off_x + 2) - x(off_x + 2);

    // ROTATION (quaternions): Dq_loc = q_old^-1 * q_new,
    //  because   q_new = Dq_abs * q_old   = q_old * Dq_loc
    ChQuaternion<> q_old(x.segment(off_x + 3, 4));
    ChQuaternion<> q_new(x_new.segment(off_x + 3, 4));
    ChQuaternion<> rel_q = q_old.GetConjugate() % q_new;
    Dv.segment(off_v + 3, 3) = rel_q.Q_to_Rotv().eigen();
}